

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::FunctionParam<void_()>::
Wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1835:27)>
::operator()(Wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1835:27)>
             *this)

{
  anon_class_24_3_74fd5ae7 *paVar1;
  undefined8 in_RAX;
  bool bVar2;
  DebugExpression<bool> _kjCondition_1;
  DebugExpression<bool> _kjCondition;
  char c;
  char c_1;
  char c_2;
  undefined4 uStack_18;
  DebugExpression<bool> local_14;
  undefined1 local_13 [2];
  undefined1 local_11;
  
  paVar1 = this->func;
  bVar2 = *paVar1->ptr1 + (0xffff - (long)local_13) < (char *)0x1ffff;
  _local_13 = (undefined3)((ulong)in_RAX >> 0x28);
  uStack_18 = (undefined4)in_RAX;
  _uStack_18 = CONCAT14(bVar2,uStack_18);
  if (kj::_::Debug::minSeverity < 3 && !bVar2) {
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x72d,ERROR,"\"failed: expected \" \"onOurStack(ptr1)\", _kjCondition",
               (char (*) [34])"failed: expected onOurStack(ptr1)",&local_14);
  }
  bVar2 = *paVar1->ptr2 + (0xffff - (long)(local_13 + 1)) < (char *)0x1ffff;
  uStack_18 = CONCAT13(bVar2,(undefined3)uStack_18);
  if (kj::_::Debug::minSeverity < 3 && !bVar2) {
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x72e,ERROR,"\"failed: expected \" \"onOurStack(ptr2)\", _kjCondition",
               (char (*) [34])"failed: expected onOurStack(ptr2)",
               (DebugExpression<bool> *)((long)&uStack_18 + 3));
  }
  bVar2 = paVar1->port->waitStack + (-0x10000 - (long)&local_11) < (char *)0xfffffffffffe0001;
  uStack_18._0_3_ = CONCAT12(bVar2,(undefined2)uStack_18);
  if ((!bVar2) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[47],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x72f,ERROR,"\"failed: expected \" \"notOnOurStack(port.waitStack)\", _kjCondition",
               (char (*) [47])"failed: expected notOnOurStack(port.waitStack)",
               (DebugExpression<bool> *)((long)&uStack_18 + 2));
  }
  return;
}

Assistant:

inline Return operator()(Params... params) override {
      return func(kj::fwd<Params>(params)...);
    }